

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool>
               (interval_t *ldata,double *rdata,interval_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  sel_t *psVar5;
  undefined4 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  unsigned_long *puVar7;
  undefined4 uVar9;
  byte bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ulong uVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  ulong uVar15;
  sel_t *psVar16;
  idx_t idx_in_entry;
  ulong uVar17;
  int64_t *piVar18;
  interval_t left;
  interval_t left_00;
  interval_t iVar19;
  interval_t iVar20;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  sel_t *local_60;
  idx_t local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  ulong local_48;
  interval_t *local_40;
  double *local_38;
  
  local_48 = count;
  local_40 = ldata;
  local_38 = rdata;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar16 = lsel->sel_vector;
      psVar5 = rsel->sel_vector;
      local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
      piVar18 = &result_data->micros;
      uVar17 = 0;
      local_60 = psVar16;
      do {
        uVar13 = uVar17;
        if (psVar16 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar16[uVar17];
        }
        uVar15 = uVar17;
        if (psVar5 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar5[uVar17];
        }
        uVar3 = local_40[uVar13].months;
        uVar8 = local_40[uVar13].days;
        left.days = uVar8;
        left.months = uVar3;
        iVar19.micros = local_40[uVar13].micros;
        iVar19.months = uVar3;
        iVar19.days = uVar8;
        dVar2 = local_38[uVar15];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          left.micros = local_40[uVar13].micros;
          iVar19 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                             (left,dVar2);
          count = local_48;
        }
        else {
          if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_78,&local_58);
            p_Var12 = p_Stack_70;
            peVar11 = local_78;
            local_78 = (element_type *)0x0;
            p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var6 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar11;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var12;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_50);
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            psVar16 = local_60;
            count = local_48;
          }
          bVar10 = (byte)uVar17 & 0x3f;
          puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   (uVar17 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
        }
        ((interval_t *)(piVar18 + -1))->months = (int)iVar19._0_8_;
        ((interval_t *)(piVar18 + -1))->days = (int)((ulong)iVar19._0_8_ >> 0x20);
        *piVar18 = iVar19.micros;
        uVar17 = uVar17 + 1;
        piVar18 = piVar18 + 2;
      } while (count != uVar17);
    }
  }
  else if (count != 0) {
    psVar16 = lsel->sel_vector;
    psVar5 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar18 = &result_data->micros;
    uVar17 = 0;
    local_60 = psVar16;
    do {
      uVar13 = uVar17;
      if (psVar16 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar16[uVar17];
      }
      uVar15 = uVar17;
      if (psVar5 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar5[uVar17];
      }
      puVar7 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar7 == (unsigned_long *)0x0) || ((puVar7[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0))
         && ((puVar7 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)))
         ) {
        uVar4 = local_40[uVar13].months;
        uVar9 = local_40[uVar13].days;
        left_00.days = uVar9;
        left_00.months = uVar4;
        iVar20.micros = local_40[uVar13].micros;
        iVar20.months = uVar4;
        iVar20.days = uVar9;
        dVar2 = local_38[uVar15];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          left_00.micros = local_40[uVar13].micros;
          iVar20 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                             (left_00,dVar2);
          psVar16 = local_60;
        }
        else {
          if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_78,&local_58);
            p_Var12 = p_Stack_70;
            peVar11 = local_78;
            local_78 = (element_type *)0x0;
            p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var6 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar11;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var12;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_50);
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            psVar16 = local_60;
          }
          bVar10 = (byte)uVar17 & 0x3f;
          puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   (uVar17 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
        }
        ((interval_t *)(piVar18 + -1))->months = (int)iVar20._0_8_;
        ((interval_t *)(piVar18 + -1))->days = (int)((ulong)iVar20._0_8_ >> 0x20);
        *piVar18 = iVar20.micros;
        count = local_48;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_58);
          p_Var12 = p_Stack_70;
          peVar11 = local_78;
          local_78 = (element_type *)0x0;
          p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar11;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var12;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
          }
          pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_50);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar14->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          count = local_48;
          psVar16 = local_60;
        }
        bVar10 = (byte)uVar17 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar17 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
      }
      uVar17 = uVar17 + 1;
      piVar18 = piVar18 + 2;
    } while (count != uVar17);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}